

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O3

bool all_tensors_in_other(gguf_context *ctx,gguf_context *other)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *__s;
  long lVar6;
  long lVar7;
  ulong uVar8;
  string name;
  allocator<char> local_59;
  gguf_context *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58 = other;
  uVar2 = gguf_get_n_tensors();
  if ((int)uVar2 < 1) {
    bVar1 = true;
  }
  else {
    bVar1 = true;
    uVar8 = 0;
    do {
      __s = (char *)gguf_get_tensor_name(ctx,uVar8);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_59);
      uVar3 = gguf_find_tensor(local_58,local_50[0]);
      if ((uVar8 == uVar3) || (bVar1 = false, -1 < (int)uVar3)) {
        iVar4 = gguf_get_tensor_type(ctx,uVar8);
        iVar5 = gguf_get_tensor_type(local_58,uVar8);
        lVar6 = gguf_get_tensor_offset(ctx,uVar8);
        lVar7 = gguf_get_tensor_offset(local_58,uVar8);
        bVar1 = (bool)((lVar6 == lVar7 && iVar4 == iVar5) & bVar1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      uVar8 = uVar8 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar8);
  }
  return bVar1;
}

Assistant:

static bool all_tensors_in_other(const gguf_context * ctx, const gguf_context * other) {
    bool ok = true;

    const int n_tensors = gguf_get_n_tensors(ctx);
    for (int id = 0; id < n_tensors; ++id) {
        const std::string name = gguf_get_tensor_name(ctx, id);

        const int idx_other = gguf_find_tensor(other, name.c_str());
        if (id != idx_other) {
            ok = false;
            if (idx_other < 0) {
                continue;
            }
        }

        const ggml_type type = gguf_get_tensor_type(ctx, id);
        if (type != gguf_get_tensor_type(other, id)) {
            ok = false;
        }

        const size_t offset = gguf_get_tensor_offset(ctx, id);
        if (offset != gguf_get_tensor_offset(other, id)) {
            ok = false;
        }
    }

    return ok;
}